

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

void __thiscall
caffe::ConvolutionParameter::MergeFrom(ConvolutionParameter *this,ConvolutionParameter *from)

{
  int iVar1;
  uint uVar2;
  void *pvVar3;
  LogMessage *pLVar4;
  FillerParameter *pFVar5;
  LogFinisher local_139;
  LogMessage local_138;
  LogMessage local_100;
  LogMessage local_c8;
  LogMessage local_90;
  LogMessage local_58;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_100,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
               ,0x567d);
    pLVar4 = google::protobuf::internal::LogMessage::operator<<
                       (&local_100,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_138,pLVar4);
    google::protobuf::internal::LogMessage::~LogMessage(&local_100);
  }
  pvVar3 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar3 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe));
  }
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_c8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b6);
    pLVar4 = google::protobuf::internal::LogMessage::operator<<
                       (&local_c8,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_138,pLVar4);
    google::protobuf::internal::LogMessage::~LogMessage(&local_c8);
  }
  iVar1 = (from->pad_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<unsigned_int>::Reserve
              (&this->pad_,iVar1 + (this->pad_).current_size_);
    memcpy(((this->pad_).rep_)->elements + (this->pad_).current_size_,((from->pad_).rep_)->elements,
           (long)(from->pad_).current_size_ << 2);
    (this->pad_).current_size_ = (this->pad_).current_size_ + (from->pad_).current_size_;
  }
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_90,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b6);
    pLVar4 = google::protobuf::internal::LogMessage::operator<<
                       (&local_90,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_138,pLVar4);
    google::protobuf::internal::LogMessage::~LogMessage(&local_90);
  }
  iVar1 = (from->kernel_size_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<unsigned_int>::Reserve
              (&this->kernel_size_,iVar1 + (this->kernel_size_).current_size_);
    memcpy(((this->kernel_size_).rep_)->elements + (this->kernel_size_).current_size_,
           ((from->kernel_size_).rep_)->elements,(long)(from->kernel_size_).current_size_ << 2);
    (this->kernel_size_).current_size_ =
         (this->kernel_size_).current_size_ + (from->kernel_size_).current_size_;
  }
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b6);
    pLVar4 = google::protobuf::internal::LogMessage::operator<<
                       (&local_58,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_138,pLVar4);
    google::protobuf::internal::LogMessage::~LogMessage(&local_58);
  }
  iVar1 = (from->stride_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<unsigned_int>::Reserve
              (&this->stride_,iVar1 + (this->stride_).current_size_);
    memcpy(((this->stride_).rep_)->elements + (this->stride_).current_size_,
           ((from->stride_).rep_)->elements,(long)(from->stride_).current_size_ << 2);
    (this->stride_).current_size_ = (this->stride_).current_size_ + (from->stride_).current_size_;
  }
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_138,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x4b6);
    pLVar4 = google::protobuf::internal::LogMessage::operator<<
                       (&local_138,"CHECK failed: (&other) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_139,pLVar4);
    google::protobuf::internal::LogMessage::~LogMessage(&local_138);
  }
  iVar1 = (from->dilation_).current_size_;
  if (iVar1 != 0) {
    google::protobuf::RepeatedField<unsigned_int>::Reserve
              (&this->dilation_,iVar1 + (this->dilation_).current_size_);
    memcpy(((this->dilation_).rep_)->elements + (this->dilation_).current_size_,
           ((from->dilation_).rep_)->elements,(long)(from->dilation_).current_size_ << 2);
    (this->dilation_).current_size_ =
         (this->dilation_).current_size_ + (from->dilation_).current_size_;
  }
  uVar2 = (from->_has_bits_).has_bits_[0];
  if ((char)uVar2 != '\0') {
    if ((uVar2 & 1) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      if (this->weight_filler_ == (FillerParameter *)0x0) {
        pFVar5 = (FillerParameter *)operator_new(0x40);
        FillerParameter::FillerParameter(pFVar5);
        this->weight_filler_ = pFVar5;
      }
      pFVar5 = from->weight_filler_;
      if (pFVar5 == (FillerParameter *)0x0) {
        pFVar5 = (FillerParameter *)&_FillerParameter_default_instance_;
      }
      FillerParameter::MergeFrom(this->weight_filler_,pFVar5);
    }
    if ((uVar2 & 2) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
      if (this->bias_filler_ == (FillerParameter *)0x0) {
        pFVar5 = (FillerParameter *)operator_new(0x40);
        FillerParameter::FillerParameter(pFVar5);
        this->bias_filler_ = pFVar5;
      }
      pFVar5 = from->bias_filler_;
      if (pFVar5 == (FillerParameter *)0x0) {
        pFVar5 = (FillerParameter *)&_FillerParameter_default_instance_;
      }
      FillerParameter::MergeFrom(this->bias_filler_,pFVar5);
    }
    if ((uVar2 & 4) != 0) {
      this->num_output_ = from->num_output_;
    }
    if ((uVar2 & 8) != 0) {
      this->pad_h_ = from->pad_h_;
    }
    if ((uVar2 & 0x10) != 0) {
      this->pad_w_ = from->pad_w_;
    }
    if ((uVar2 & 0x20) != 0) {
      this->kernel_h_ = from->kernel_h_;
    }
    if ((uVar2 & 0x40) != 0) {
      this->kernel_w_ = from->kernel_w_;
    }
    if ((char)uVar2 < '\0') {
      this->stride_h_ = from->stride_h_;
    }
    (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar2;
  }
  if ((uVar2 & 0x3f00) != 0) {
    if ((uVar2 >> 8 & 1) != 0) {
      this->stride_w_ = from->stride_w_;
    }
    if ((uVar2 >> 9 & 1) != 0) {
      this->engine_ = from->engine_;
    }
    if ((uVar2 >> 10 & 1) != 0) {
      this->force_nd_im2col_ = from->force_nd_im2col_;
    }
    if ((uVar2 >> 0xb & 1) != 0) {
      this->axis_ = from->axis_;
    }
    if ((uVar2 >> 0xc & 1) != 0) {
      this->bias_term_ = from->bias_term_;
    }
    if ((uVar2 >> 0xd & 1) != 0) {
      this->group_ = from->group_;
    }
    (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar2;
  }
  return;
}

Assistant:

void ConvolutionParameter::MergeFrom(const ConvolutionParameter& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:caffe.ConvolutionParameter)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  pad_.MergeFrom(from.pad_);
  kernel_size_.MergeFrom(from.kernel_size_);
  stride_.MergeFrom(from.stride_);
  dilation_.MergeFrom(from.dilation_);
  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 255u) {
    if (cached_has_bits & 0x00000001u) {
      mutable_weight_filler()->::caffe::FillerParameter::MergeFrom(from.weight_filler());
    }
    if (cached_has_bits & 0x00000002u) {
      mutable_bias_filler()->::caffe::FillerParameter::MergeFrom(from.bias_filler());
    }
    if (cached_has_bits & 0x00000004u) {
      num_output_ = from.num_output_;
    }
    if (cached_has_bits & 0x00000008u) {
      pad_h_ = from.pad_h_;
    }
    if (cached_has_bits & 0x00000010u) {
      pad_w_ = from.pad_w_;
    }
    if (cached_has_bits & 0x00000020u) {
      kernel_h_ = from.kernel_h_;
    }
    if (cached_has_bits & 0x00000040u) {
      kernel_w_ = from.kernel_w_;
    }
    if (cached_has_bits & 0x00000080u) {
      stride_h_ = from.stride_h_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
  if (cached_has_bits & 16128u) {
    if (cached_has_bits & 0x00000100u) {
      stride_w_ = from.stride_w_;
    }
    if (cached_has_bits & 0x00000200u) {
      engine_ = from.engine_;
    }
    if (cached_has_bits & 0x00000400u) {
      force_nd_im2col_ = from.force_nd_im2col_;
    }
    if (cached_has_bits & 0x00000800u) {
      axis_ = from.axis_;
    }
    if (cached_has_bits & 0x00001000u) {
      bias_term_ = from.bias_term_;
    }
    if (cached_has_bits & 0x00002000u) {
      group_ = from.group_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
}